

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

uint32_t helper_vfp_get_fpscr_aarch64(CPUARMState_conflict *env)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t fpscr;
  uint32_t i;
  CPUARMState_conflict *env_local;
  
  uVar1 = (env->vfp).xregs[1];
  iVar2 = (env->vfp).vec_len;
  iVar3 = (env->vfp).vec_stride;
  uVar4 = vfp_get_fpscr_from_host(env);
  uVar5 = 0;
  if ((((env->vfp).qc[0] != 0 || (env->vfp).qc[1] != 0) || (env->vfp).qc[2] != 0) ||
      (env->vfp).qc[3] != 0) {
    uVar5 = 0x8000000;
  }
  return uVar5 | uVar4 | uVar1 | iVar2 << 0x10 | iVar3 << 0x14;
}

Assistant:

uint32_t HELPER(vfp_get_fpscr)(CPUARMState *env)
{
    uint32_t i, fpscr;

    fpscr = env->vfp.xregs[ARM_VFP_FPSCR]
            | (env->vfp.vec_len << 16)
            | (env->vfp.vec_stride << 20);

    fpscr |= vfp_get_fpscr_from_host(env);

    i = env->vfp.qc[0] | env->vfp.qc[1] | env->vfp.qc[2] | env->vfp.qc[3];
    fpscr |= i ? FPCR_QC : 0;

    return fpscr;
}